

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

void sink_mark_ins(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  int iVar4;
  IRIns *pIVar5;
  IRIns *irr;
  IRIns *irl;
  IRIns *ira;
  IRIns *irlast;
  IRIns *ir;
  jit_State *J_local;
  
  irlast = (J->cur).ir + ((J->cur).nins - 1);
  do {
    switch((irlast->field_1).o) {
    case '\r':
      return;
    default:
      if ((((irlast->field_1).t.irt & 0x20) != 0) || (((irlast->field_1).t.irt & 0x80) != 0)) {
        if (0x8000 < (irlast->field_0).op1) {
          pIVar5 = (J->cur).ir;
          *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) =
               *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) | 0x20;
        }
        if (0x8000 < (irlast->field_0).op2) {
          pIVar5 = (J->cur).ir;
          *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op2 * 8 + 4) =
               *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op2 * 8 + 4) | 0x20;
        }
      }
      break;
    case '\x13':
      pIVar5 = (J->cur).ir;
      uVar1 = (irlast->field_0).op1;
      pIVar3 = (J->cur).ir;
      uVar2 = (irlast->field_0).op2;
      (&pIVar3->field_0)[uVar2].prev = 0;
      (&pIVar5->field_0)[uVar1].prev = 0;
      if (((&pIVar5->field_1)[uVar1].o != (&pIVar3->field_1)[uVar2].o) ||
         (((((&pIVar5->field_1)[uVar1].o != 'Q' && ((&pIVar5->field_1)[uVar1].o != 'R')) &&
           ((&pIVar5->field_1)[uVar1].o != 'S')) && ((&pIVar5->field_1)[uVar1].o != 'T')))) {
        (&pIVar5->field_1)[uVar1].t.irt = (&pIVar5->field_1)[uVar1].t.irt | 0x20;
        (&pIVar3->field_1)[uVar2].t.irt = (&pIVar3->field_1)[uVar2].t.irt | 0x20;
      }
      break;
    case 'B':
    case 'C':
    case 'F':
    case 'I':
    case 'X':
      pIVar5 = (J->cur).ir;
      *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) =
           *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) | 0x20;
      break;
    case 'E':
      if ((((irlast->field_1).t.irt & 0x20) != 0) || ((irlast->field_0).op2 == 7)) {
        pIVar5 = (J->cur).ir;
        *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) =
             *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) | 0x20;
      }
      break;
    case 'J':
    case 'K':
    case 'M':
    case 'N':
      pIVar5 = sink_checkalloc(J,irlast);
      if ((pIVar5 == (IRIns *)0x0) ||
         ((((pIVar5->field_1).t.irt & 0x40) != 0 &&
          (iVar4 = sink_checkphi(J,pIVar5,(uint)(irlast->field_0).op2), iVar4 == 0)))) {
        pIVar5 = (J->cur).ir;
        *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) =
             *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) | 0x20;
      }
      pIVar5 = (J->cur).ir;
      *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op2 * 8 + 4) =
           *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op2 * 8 + 4) | 0x20;
      break;
    case 'T':
      if ((((irlast->field_1).t.irt & 0x40) != 0) &&
         (iVar4 = sink_checkphi(J,irlast,(uint)(irlast->field_0).op2), iVar4 == 0)) {
        (irlast->field_1).t.irt = (irlast->field_1).t.irt | 0x20;
      }
    case 'L':
      pIVar5 = (J->cur).ir;
      *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op2 * 8 + 4) =
           *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op2 * 8 + 4) | 0x20;
      break;
    case 'b':
    case 'c':
      pIVar5 = (J->cur).ir;
      *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) =
           *(byte *)((long)pIVar5 + (ulong)(irlast->field_0).op1 * 8 + 4) | 0x20;
    }
    irlast = irlast + -1;
  } while( true );
}

Assistant:

static void sink_mark_ins(jit_State *J)
{
  IRIns *ir, *irlast = IR(J->cur.nins-1);
  for (ir = irlast ; ; ir--) {
    switch (ir->o) {
    case IR_BASE:
      return;  /* Finished. */
    case IR_ALOAD: case IR_HLOAD: case IR_XLOAD: case IR_TBAR: case IR_ALEN:
      irt_setmark(IR(ir->op1)->t);  /* Mark ref for remaining loads. */
      break;
    case IR_FLOAD:
      if (irt_ismarked(ir->t) || ir->op2 == IRFL_TAB_META)
	irt_setmark(IR(ir->op1)->t);  /* Mark table for remaining loads. */
      break;
    case IR_ASTORE: case IR_HSTORE: case IR_FSTORE: case IR_XSTORE: {
      IRIns *ira = sink_checkalloc(J, ir);
      if (!ira || (irt_isphi(ira->t) && !sink_checkphi(J, ira, ir->op2)))
	irt_setmark(IR(ir->op1)->t);  /* Mark ineligible ref. */
      irt_setmark(IR(ir->op2)->t);  /* Mark stored value. */
      break;
      }
#if LJ_HASFFI
    case IR_CNEWI:
      if (irt_isphi(ir->t) &&
	  (!sink_checkphi(J, ir, ir->op2) ||
	   (LJ_32 && ir+1 < irlast && (ir+1)->o == IR_HIOP &&
	    !sink_checkphi(J, ir, (ir+1)->op2))))
	irt_setmark(ir->t);  /* Mark ineligible allocation. */
#endif
      /* fallthrough */
    case IR_USTORE:
      irt_setmark(IR(ir->op2)->t);  /* Mark stored value. */
      break;
#if LJ_HASFFI
    case IR_CALLXS:
#endif
    case IR_CALLS:
      irt_setmark(IR(ir->op1)->t);  /* Mark (potentially) stored values. */
      break;
    case IR_PHI: {
      IRIns *irl = IR(ir->op1), *irr = IR(ir->op2);
      irl->prev = irr->prev = 0;  /* Clear PHI value counts. */
      if (irl->o == irr->o &&
	  (irl->o == IR_TNEW || irl->o == IR_TDUP ||
	   (LJ_HASFFI && (irl->o == IR_CNEW || irl->o == IR_CNEWI))))
	break;
      irt_setmark(irl->t);
      irt_setmark(irr->t);
      break;
      }
    default:
      if (irt_ismarked(ir->t) || irt_isguard(ir->t)) {  /* Propagate mark. */
	if (ir->op1 >= REF_FIRST) irt_setmark(IR(ir->op1)->t);
	if (ir->op2 >= REF_FIRST) irt_setmark(IR(ir->op2)->t);
      }
      break;
    }
  }
}